

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
::emplace_value<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const&>
          (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
           *this,field_type i,allocator_type *alloc,SymbolEntry *args)

{
  uint uVar1;
  byte bVar2;
  field_type fVar3;
  bool bVar4;
  template_ElementType<2UL> *ptVar5;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
  *c;
  uint uVar6;
  undefined7 in_register_00000031;
  int iVar7;
  
  bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
          ::start((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                   *)this);
  if (i < bVar2) {
    __assert_fail("i >= start()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x709,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>>::emplace_value(const field_type, allocator_type *, Args &&...) [Params = absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>, Args = <const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry &>]"
                 );
  }
  bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
          ::finish((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                    *)this);
  if (i <= bVar2) {
    bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
            ::finish((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                      *)this);
    iVar7 = (int)CONCAT71(in_register_00000031,i);
    if (i < bVar2) {
      bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
              ::finish((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                        *)this);
      btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
      ::transfer_n_backward
                ((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                  *)this,(long)(int)((uint)bVar2 - iVar7),(ulong)(iVar7 + 1),(ulong)i,
                 (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                  *)this,alloc);
    }
    value_init<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const&>
              (this,i,alloc,args);
    fVar3 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
            ::finish((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                      *)this);
    ptVar5 = GetField<2ul>(this);
    ptVar5[2] = fVar3 + '\x01';
    bVar4 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
            ::is_internal((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                           *)this);
    if (bVar4) {
      bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
              ::finish((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                        *)this);
      if (iVar7 + 1U < (uint)bVar2) {
        bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                ::finish((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                          *)this);
        uVar6 = (uint)bVar2;
        while (iVar7 + 1U < (uVar6 & 0xff)) {
          uVar1 = (uVar6 & 0xff) - 1;
          c = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
              ::child((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                       *)this,(field_type)uVar1);
          btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
          ::set_child((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                       *)this,(field_type)uVar6,c);
          uVar6 = uVar1;
        }
        GetField<4ul>(this);
        return;
      }
    }
    return;
  }
  __assert_fail("i <= finish()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                ,0x70a,
                "void absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>>::emplace_value(const field_type, allocator_type *, Args &&...) [Params = absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>, Args = <const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry &>]"
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const field_type i,
                                         allocator_type *alloc,
                                         Args &&...args) {
  assert(i >= start());
  assert(i <= finish());
  // Shift old values to create space for new value and then construct it in
  // place.
  if (i < finish()) {
    transfer_n_backward(finish() - i, /*dest_i=*/i + 1, /*src_i=*/i, this,
                        alloc);
  }
  value_init(static_cast<field_type>(i), alloc, std::forward<Args>(args)...);
  set_finish(finish() + 1);

  if (is_internal() && finish() > i + 1) {
    for (field_type j = finish(); j > i + 1; --j) {
      set_child(j, child(j - 1));
    }
    clear_child(i + 1);
  }
}